

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O0

void __thiscall
TorController::authchallenge_cb
          (TorController *this,TorControlConnection *_conn,TorControlReply *reply)

{
  string_view str;
  string_view hex_str;
  string_view hex_str_00;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  Span<const_unsigned_char> s_02;
  Span<const_unsigned_char> s_03;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  mapped_type *this_00;
  size_type sVar5;
  int *in_RDX;
  string *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  __sv_type _Var6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> computedClientHash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> computedServerHash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> serverNonce;
  vector<unsigned_char,_std::allocator<unsigned_char>_> serverHash;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  l;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  char *in_stack_fffffffffffffb70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb78;
  _Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>
  *in_stack_fffffffffffffb80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb88;
  ReplyHandlerCB *in_stack_fffffffffffffb90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffb98;
  undefined6 in_stack_fffffffffffffba0;
  allocator<char> *in_stack_fffffffffffffba8;
  string *in_stack_fffffffffffffbb0;
  int rule;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb8;
  size_t in_stack_fffffffffffffbc0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *serverNonce_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *clientNonce;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  undefined4 uVar7;
  int source_line;
  uchar *in_stack_fffffffffffffbf0;
  char *pcVar8;
  size_t in_stack_fffffffffffffbf8;
  ConstevalFormatString<0U> in_stack_fffffffffffffc18;
  ConstevalFormatString<0U> fmt;
  undefined8 in_stack_fffffffffffffc20;
  char *pcVar9;
  undefined4 in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc2c;
  string_view in_stack_fffffffffffffc30;
  string *in_stack_fffffffffffffca0;
  Level in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  allocator<char> local_211 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1f1 [7];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  _Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>
  local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [5];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = (undefined4)in_RDI;
  source_line = (int)((ulong)in_RDI >> 0x20);
  if (*in_RDX == 0xfa) {
    bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),Trace)
    ;
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb88,
                 (char *)in_stack_fffffffffffffb80);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb88,
                 (char *)in_stack_fffffffffffffb80);
      in_stack_fffffffffffffb68 = 1;
      in_stack_fffffffffffffb70 = "SAFECOOKIE authentication challenge successful\n";
      source_file._M_str._0_4_ = in_stack_fffffffffffffc28;
      source_file._M_len = in_stack_fffffffffffffc20;
      source_file._M_str._4_4_ = in_stack_fffffffffffffc2c;
      LogPrintFormatInternal<>
                (in_stack_fffffffffffffc30,source_file,source_line,
                 CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
                 in_stack_fffffffffffffd10,in_stack_fffffffffffffc18);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffb78,(size_type)in_stack_fffffffffffffb70);
    clientNonce = local_48;
    SplitTorReplyLine(in_stack_fffffffffffffbb0);
    uVar2 = std::operator==(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
    if ((bool)uVar2) {
      ParseTorReplyMapping(in_stack_fffffffffffffca0);
      bVar1 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb88,
                   (char *)in_stack_fffffffffffffb80);
        rule = (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb88,
                   (char *)in_stack_fffffffffffffb80);
        _Var6 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffb88);
        str._M_str = (char *)clientNonce;
        str._M_len = in_stack_fffffffffffffbc0;
        SanitizeString_abi_cxx11_(str,rule);
        in_stack_fffffffffffffb68 = 2;
        source_file_00._M_str._0_4_ = in_stack_fffffffffffffc28;
        source_file_00._M_len = in_stack_fffffffffffffc20;
        source_file_00._M_str._4_4_ = in_stack_fffffffffffffc2c;
        LogPrintFormatInternal<std::__cxx11::string>
                  (_Var6,source_file_00,source_line,CONCAT17(uVar2,in_stack_fffffffffffffbd0),
                   in_stack_fffffffffffffd10,
                   (ConstevalFormatString<1U>)in_stack_fffffffffffffc18.fmt,
                   in_stack_fffffffffffffd20);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      }
      else {
        serverNonce_00 = local_1f1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0,
                   in_stack_fffffffffffffba8);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
        _Var6 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffb88);
        fmt.fmt = (char *)_Var6._M_len;
        pcVar9 = _Var6._M_str;
        hex_str._M_len._7_1_ = uVar2;
        hex_str._M_len._0_7_ = in_stack_fffffffffffffbd0;
        hex_str._M_str._0_4_ = uVar7;
        hex_str._M_str._4_4_ = source_line;
        ParseHex<unsigned_char>(hex_str);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
        std::allocator<char>::~allocator((allocator<char> *)local_1f1);
        __s = local_211;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,(char *)__s,in_stack_fffffffffffffba8);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffb88);
        hex_str_00._M_len._7_1_ = uVar2;
        hex_str_00._M_len._0_7_ = in_stack_fffffffffffffbd0;
        hex_str_00._M_str._0_4_ = uVar7;
        hex_str_00._M_str._4_4_ = source_line;
        ParseHex<unsigned_char>(hex_str_00);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
        std::allocator<char>::~allocator(local_211);
        uVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                                    Trace);
        if ((bool)uVar3) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb88,
                     (char *)in_stack_fffffffffffffb80);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb88,
                     (char *)in_stack_fffffffffffffb80);
          Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<const_unsigned_char> *)in_stack_fffffffffffffb78,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffb70,
                     (type)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
          s.m_size = in_stack_fffffffffffffbf8;
          s.m_data = in_stack_fffffffffffffbf0;
          HexStr_abi_cxx11_(s);
          Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<const_unsigned_char> *)in_stack_fffffffffffffb78,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffb70,
                     (type)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
          s_00.m_size = in_stack_fffffffffffffbf8;
          s_00.m_data = in_stack_fffffffffffffbf0;
          HexStr_abi_cxx11_(s_00);
          in_stack_fffffffffffffb80 = &local_118;
          in_stack_fffffffffffffb78 = local_f8;
          in_stack_fffffffffffffb70 = "AUTHCHALLENGE ServerHash %s ServerNonce %s\n";
          in_stack_fffffffffffffb68 = 1;
          source_file_01._M_str._0_4_ = in_stack_fffffffffffffc28;
          source_file_01._M_len = (size_t)pcVar9;
          source_file_01._M_str._4_4_ = in_stack_fffffffffffffc2c;
          LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                    (in_stack_fffffffffffffc30,source_file_01,source_line,
                     CONCAT17(uVar2,in_stack_fffffffffffffbd0),in_stack_fffffffffffffd10,
                     (ConstevalFormatString<2U>)fmt.fmt,in_stack_fffffffffffffd20,
                     in_stack_fffffffffffffd28);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
        }
        sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
        if (sVar5 == 0x20) {
          ComputeResponse((string *)CONCAT44(source_line,uVar7),
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          CONCAT17(uVar2,in_stack_fffffffffffffbd0),clientNonce,serverNonce_00);
          uVar4 = std::operator==(in_stack_fffffffffffffb98,
                                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  in_stack_fffffffffffffb90);
          if (((uVar4 ^ 0xff) & 1) == 0) {
            ComputeResponse((string *)CONCAT44(source_line,uVar7),
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            CONCAT17(uVar2,in_stack_fffffffffffffbd0),clientNonce,serverNonce_00);
            Span<unsigned_char_const>::
            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((Span<const_unsigned_char> *)in_stack_fffffffffffffb78,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffb70,
                       (type)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
            s_03.m_size = in_stack_fffffffffffffbf8;
            s_03.m_data = in_stack_fffffffffffffbf0;
            HexStr_abi_cxx11_(s_03);
            std::operator+((char *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
            std::
            bind<void(TorController::*)(TorControlConnection&,TorControlReply_const&),TorController*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                      (&in_stack_fffffffffffffb80->_M_f,(TorController **)in_stack_fffffffffffffb78,
                       (_Placeholder<1> *)in_stack_fffffffffffffb70,
                       (_Placeholder<2> *)
                       CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
            std::function<void(TorControlConnection&,TorControlReply_const&)>::
            function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>,std::_Placeholder<2>))(TorControlConnection&,TorControlReply_const&)>,void>
                      ((function<void_(TorControlConnection_&,_const_TorControlReply_&)> *)
                       in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
            TorControlConnection::Command
                      ((TorControlConnection *)
                       CONCAT17(uVar3,CONCAT16(uVar4,in_stack_fffffffffffffba0)),in_RSI,
                       in_stack_fffffffffffffb90);
            std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>::~function
                      ((function<void_(TorControlConnection_&,_const_TorControlReply_&)> *)
                       CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffb78);
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb88
                       ,(char *)in_stack_fffffffffffffb80);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb88
                       ,(char *)in_stack_fffffffffffffb80);
            pcVar8 = "tor: ServerHash %s does not match expected ServerHash %s\n";
            Span<unsigned_char_const>::
            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((Span<const_unsigned_char> *)in_stack_fffffffffffffb78,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffb70,
                       (type)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
            s_01.m_size = in_stack_fffffffffffffbf8;
            s_01.m_data = (uchar *)pcVar8;
            HexStr_abi_cxx11_(s_01);
            Span<unsigned_char_const>::
            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((Span<const_unsigned_char> *)in_stack_fffffffffffffb78,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffb70,
                       (type)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
            s_02.m_size = in_stack_fffffffffffffbf8;
            s_02.m_data = (uchar *)pcVar8;
            HexStr_abi_cxx11_(s_02);
            in_stack_fffffffffffffb78 = &local_138;
            in_stack_fffffffffffffb68 = 2;
            source_file_03._M_str._0_4_ = in_stack_fffffffffffffc28;
            source_file_03._M_len = (size_t)pcVar9;
            source_file_03._M_str._4_4_ = in_stack_fffffffffffffc2c;
            LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                      (in_stack_fffffffffffffc30,source_file_03,source_line,
                       CONCAT17(uVar2,in_stack_fffffffffffffbd0),in_stack_fffffffffffffd10,
                       (ConstevalFormatString<2U>)fmt.fmt,in_stack_fffffffffffffd20,
                       in_stack_fffffffffffffd28);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffb78);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb88,
                     (char *)in_stack_fffffffffffffb80);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb88,
                     (char *)in_stack_fffffffffffffb80);
          in_stack_fffffffffffffb68 = 2;
          source_file_02._M_str._0_4_ = in_stack_fffffffffffffc28;
          source_file_02._M_len = (size_t)pcVar9;
          source_file_02._M_str._4_4_ = in_stack_fffffffffffffc2c;
          LogPrintFormatInternal<>
                    (in_stack_fffffffffffffc30,source_file_02,source_line,
                     CONCAT17(uVar2,in_stack_fffffffffffffbd0),in_stack_fffffffffffffd10,fmt);
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffb78);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffb78);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb88,
                 (char *)in_stack_fffffffffffffb80);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb88,
                 (char *)in_stack_fffffffffffffb80);
      in_stack_fffffffffffffb68 = 2;
      source_file_04._M_str._0_4_ = in_stack_fffffffffffffc28;
      source_file_04._M_len = in_stack_fffffffffffffc20;
      source_file_04._M_str._4_4_ = in_stack_fffffffffffffc2c;
      LogPrintFormatInternal<>
                (in_stack_fffffffffffffc30,source_file_04,source_line,
                 CONCAT17(uVar2,in_stack_fffffffffffffbd0),in_stack_fffffffffffffd10,
                 in_stack_fffffffffffffc18);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb88,
               (char *)in_stack_fffffffffffffb80);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb88,
               (char *)in_stack_fffffffffffffb80);
    source_file_05._M_str._0_4_ = in_stack_fffffffffffffc28;
    source_file_05._M_len = in_stack_fffffffffffffc20;
    source_file_05._M_str._4_4_ = in_stack_fffffffffffffc2c;
    LogPrintFormatInternal<>
              (in_stack_fffffffffffffc30,source_file_05,source_line,
               CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
               in_stack_fffffffffffffd10,in_stack_fffffffffffffc18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TorController::authchallenge_cb(TorControlConnection& _conn, const TorControlReply& reply)
{
    if (reply.code == 250) {
        LogDebug(BCLog::TOR, "SAFECOOKIE authentication challenge successful\n");
        std::pair<std::string,std::string> l = SplitTorReplyLine(reply.lines[0]);
        if (l.first == "AUTHCHALLENGE") {
            std::map<std::string,std::string> m = ParseTorReplyMapping(l.second);
            if (m.empty()) {
                LogPrintf("tor: Error parsing AUTHCHALLENGE parameters: %s\n", SanitizeString(l.second));
                return;
            }
            std::vector<uint8_t> serverHash = ParseHex(m["SERVERHASH"]);
            std::vector<uint8_t> serverNonce = ParseHex(m["SERVERNONCE"]);
            LogDebug(BCLog::TOR, "AUTHCHALLENGE ServerHash %s ServerNonce %s\n", HexStr(serverHash), HexStr(serverNonce));
            if (serverNonce.size() != 32) {
                LogPrintf("tor: ServerNonce is not 32 bytes, as required by spec\n");
                return;
            }

            std::vector<uint8_t> computedServerHash = ComputeResponse(TOR_SAFE_SERVERKEY, cookie, clientNonce, serverNonce);
            if (computedServerHash != serverHash) {
                LogPrintf("tor: ServerHash %s does not match expected ServerHash %s\n", HexStr(serverHash), HexStr(computedServerHash));
                return;
            }

            std::vector<uint8_t> computedClientHash = ComputeResponse(TOR_SAFE_CLIENTKEY, cookie, clientNonce, serverNonce);
            _conn.Command("AUTHENTICATE " + HexStr(computedClientHash), std::bind(&TorController::auth_cb, this, std::placeholders::_1, std::placeholders::_2));
        } else {
            LogPrintf("tor: Invalid reply to AUTHCHALLENGE\n");
        }
    } else {
        LogPrintf("tor: SAFECOOKIE authentication challenge failed\n");
    }
}